

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O1

size_t __thiscall
Assimp::AssbinChunkWriter::Write(AssbinChunkWriter *this,void *pvBuffer,size_t pSize,size_t pCount)

{
  size_t need;
  size_t __n;
  
  __n = pSize * pCount;
  need = this->cursor + __n;
  if (this->cur_size < need) {
    Grow(this,need);
  }
  memcpy(this->buffer + this->cursor,pvBuffer,__n);
  this->cursor = this->cursor + __n;
  return pCount;
}

Assistant:

virtual size_t Write(const void* pvBuffer, size_t pSize, size_t pCount) {
        pSize *= pCount;
        if (cursor + pSize > cur_size) {
            Grow(cursor + pSize);
        }

        memcpy(buffer+cursor, pvBuffer, pSize);
        cursor += pSize;

        return pCount;
    }